

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLSLUtils.cpp
# Opt level: O0

void Diligent::GetGLSLVersion
               (ShaderCreateInfo *ShaderCI,TargetGLSLCompiler TargetCompiler,
               RENDER_DEVICE_TYPE DeviceType,RenderDeviceShaderVersionInfo *MaxShaderVersion,
               ShaderVersion *GLSLVer,bool *IsES)

{
  undefined *puVar1;
  bool bVar2;
  undefined8 uVar3;
  Char *Message;
  ShaderVersion Args_1;
  char (*in_stack_ffffffffffffff08) [2];
  bool local_d9;
  ShaderVersion *local_d0;
  Version *local_c8;
  ShaderVersion local_c0;
  undefined1 local_b8 [8];
  string msg;
  undefined1 local_80 [8];
  string _msg;
  Version local_58;
  Version local_50;
  Version local_48;
  Version local_40;
  ShaderVersion CompilerVer;
  bool *IsES_local;
  ShaderVersion *GLSLVer_local;
  RenderDeviceShaderVersionInfo *MaxShaderVersion_local;
  RENDER_DEVICE_TYPE DeviceType_local;
  TargetGLSLCompiler TargetCompiler_local;
  ShaderCreateInfo *ShaderCI_local;
  
  CompilerVer = (ShaderVersion)IsES;
  bVar2 = IsESSL(DeviceType);
  *(bool *)CompilerVer = bVar2;
  if ((*(byte *)CompilerVer & 1) == 0) {
    local_c8 = &MaxShaderVersion->GLSL;
  }
  else {
    local_c8 = &MaxShaderVersion->GLESSL;
  }
  local_40 = *local_c8;
  if ((TargetCompiler == glslang) && ((*(byte *)CompilerVer & 1) != 0)) {
    Version::Version(&local_50,3,1);
    local_48 = Version::Max(&local_40,&local_50);
    local_40 = local_48;
  }
  if ((*(byte *)CompilerVer & 1) == 0) {
    local_d0 = &ShaderCI->GLSLVersion;
  }
  else {
    local_d0 = &ShaderCI->GLESSLVersion;
  }
  Args_1 = *local_d0;
  *GLSLVer = Args_1;
  Version::Version(&local_58);
  bVar2 = Version::operator!=(GLSLVer,&local_58);
  if (bVar2) {
    Version::Version((Version *)((long)&_msg.field_2 + 8));
    bVar2 = Version::operator!=(&local_40,(Version *)((long)&_msg.field_2 + 8));
    local_d9 = false;
    if (bVar2) {
      local_d9 = Version::operator>(GLSLVer,&local_40);
    }
    if (local_d9 != false) {
      FormatString<char[25],unsigned_int,char[2],unsigned_int,char[50],unsigned_int,char[2],unsigned_int,char[2]>
                ((string *)local_80,(Diligent *)"Requested GLSL version (",(char (*) [25])GLSLVer,
                 (uint *)0xcca6b6,(char (*) [2])&GLSLVer->Minor,
                 (uint *)") is greater than the maximum supported version (",
                 (char (*) [50])&local_40,(uint *)0xcca6b6,(char (*) [2])&local_40.Minor,
                 (uint *)0xcabce5,in_stack_ffffffffffffff08);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar3 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(1,uVar3,0);
      }
      std::__cxx11::string::~string((string *)local_80);
      GLSLVer->Major = local_40.Major;
      GLSLVer->Minor = local_40.Minor;
    }
  }
  else {
    Version::Version((Version *)((long)&msg.field_2 + 0xc));
    bVar2 = Version::operator!=(&local_40,(Version *)((long)&msg.field_2 + 0xc));
    if (bVar2) {
      GLSLVer->Major = local_40.Major;
      GLSLVer->Minor = local_40.Minor;
    }
    else {
      if ((*(byte *)CompilerVer & 1) != 0) {
        FormatString<char[26],char[6]>
                  ((string *)local_b8,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"!IsES",(char (*) [6])Args_1);
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"GetGLSLVersion",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/ShaderTools/src/GLSLUtils.cpp"
                   ,0x6e);
        std::__cxx11::string::~string((string *)local_b8);
      }
      Version::Version(&local_c0,4,3);
      *GLSLVer = local_c0;
    }
  }
  return;
}

Assistant:

void GetGLSLVersion(const ShaderCreateInfo&              ShaderCI,
                    TargetGLSLCompiler                   TargetCompiler,
                    RENDER_DEVICE_TYPE                   DeviceType,
                    const RenderDeviceShaderVersionInfo& MaxShaderVersion,
                    ShaderVersion&                       GLSLVer,
                    bool&                                IsES)
{
    IsES = IsESSL(DeviceType);

    ShaderVersion CompilerVer = IsES ? MaxShaderVersion.GLESSL : MaxShaderVersion.GLSL;
    if (TargetCompiler == TargetGLSLCompiler::glslang)
    {
        if (IsES)
        {
            // glslang requires at least GLES3.1
            CompilerVer = ShaderVersion::Max(CompilerVer, ShaderVersion{3, 1});
        }
        else
        {
#if PLATFORM_APPLE
            CompilerVer = ShaderVersion{4, 3};
#endif
        }
    }

    GLSLVer = IsES ? ShaderCI.GLESSLVersion : ShaderCI.GLSLVersion;
    if (GLSLVer != ShaderVersion{})
    {
        if (CompilerVer != ShaderVersion{} && GLSLVer > CompilerVer)
        {
            LOG_WARNING_MESSAGE("Requested GLSL version (", GLSLVer.Major, ".", GLSLVer.Minor,
                                ") is greater than the maximum supported version (",
                                CompilerVer.Major, ".", CompilerVer.Minor, ")");
            GLSLVer = CompilerVer;
        }
    }
    else if (CompilerVer != ShaderVersion{})
    {
        GLSLVer = CompilerVer;
    }
    else
    {
#if PLATFORM_WIN32 || PLATFORM_LINUX
        {
            VERIFY_EXPR(!IsES);
            GLSLVer = {4, 3};
        }
#elif PLATFORM_MACOS
        {
            VERIFY_EXPR(!IsES);
            VERIFY_EXPR(TargetCompiler == TargetGLSLCompiler::driver);
            GLSLVer = {4, 1};
        }
#elif PLATFORM_ANDROID || PLATFORM_IOS || PLATFORM_TVOS || PLATFORM_WEB
        {
            VERIFY_EXPR(IsES);
            if (DeviceType == RENDER_DEVICE_TYPE_VULKAN || DeviceType == RENDER_DEVICE_TYPE_METAL)
            {
                GLSLVer = {3, 1};
            }
            else if (DeviceType == RENDER_DEVICE_TYPE_GLES)
            {
                GLSLVer = {3, 0};
            }
            else
            {
                UNEXPECTED("Unexpected device type");
            }
        }
#else
#    error Unknown platform
#endif
    }
}